

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

int Gia_ManVerifyWithBoxes
              (Gia_Man_t *pGia,int nBTLimit,int nTimeLim,int fSeq,int fDumpFiles,int fVerbose,
              char *pFileSpec)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p;
  Vec_Int_t *vBoxPres;
  Gia_Man_t *pInit;
  Gia_Man_t *pInit_00;
  Gia_Man_t *pGVar3;
  Aig_Man_t *p_00;
  Fra_Sec_t *p_01;
  char *pcVar4;
  Gia_Man_t *pGVar5;
  char pFileName0 [1000];
  char pFileName1 [1000];
  Fra_Sec_t local_808 [8];
  char local_418 [1000];
  
  if ((pFileSpec == (char *)0x0) && (pGia->pSpec == (char *)0x0)) {
    pcVar4 = "Spec file is not given. Use standard flow.";
LAB_00237de9:
    puts(pcVar4);
    return -1;
  }
  if (((Tim_Man_t *)pGia->pManTime != (Tim_Man_t *)0x0) &&
     ((iVar1 = Tim_ManBoxNum((Tim_Man_t *)pGia->pManTime), iVar1 != 0 &&
      (pGia->pAigExtra == (Gia_Man_t *)0x0)))) {
    pcVar4 = "Design has no box logic. Use standard flow.";
    goto LAB_00237de9;
  }
  pcVar4 = pFileSpec;
  if (pFileSpec == (char *)0x0) {
    pcVar4 = pGia->pSpec;
  }
  p = Gia_AigerRead(pcVar4,0,0,0);
  if ((((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) &&
      (iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar1 != 0)) &&
     (p->pAigExtra == (Gia_Man_t *)0x0)) {
    Gia_ManStop(p);
    pcVar4 = "Spec has no box logic. Use standard flow.";
    goto LAB_00237de9;
  }
  if ((pGia->pManTime == (void *)0x0) && (p->pManTime == (void *)0x0)) {
    pInit = Gia_ManDup(p);
    pInit_00 = Gia_ManDup(pGia);
  }
  else {
    if (((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) ||
       ((iVar1 = Tim_ManBlackBoxNum((Tim_Man_t *)p->pManTime), iVar1 < 1 ||
        ((Tim_Man_t *)pGia->pManTime == (Tim_Man_t *)0x0)))) {
LAB_00237e51:
      vBoxPres = (Vec_Int_t *)0x0;
    }
    else {
      iVar1 = Tim_ManBoxNum((Tim_Man_t *)pGia->pManTime);
      vBoxPres = (Vec_Int_t *)0x0;
      iVar2 = 0;
      if (0 < iVar1) {
        if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
          iVar2 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime);
        }
        if ((Tim_Man_t *)pGia->pManTime == (Tim_Man_t *)0x0) {
          iVar1 = 0;
        }
        else {
          iVar1 = Tim_ManBoxNum((Tim_Man_t *)pGia->pManTime);
        }
        if (iVar2 < iVar1) {
          pcVar4 = "Spec has less boxes than the design. Cannot proceed.";
          goto LAB_00237de9;
        }
        iVar2 = 0;
        iVar1 = 0;
        if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
          iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime);
        }
        if ((Tim_Man_t *)pGia->pManTime != (Tim_Man_t *)0x0) {
          iVar2 = Tim_ManBoxNum((Tim_Man_t *)pGia->pManTime);
        }
        if (iVar1 <= iVar2) goto LAB_00237e51;
        vBoxPres = Tim_ManAlignTwo((Tim_Man_t *)p->pManTime,(Tim_Man_t *)pGia->pManTime);
        if (vBoxPres == (Vec_Int_t *)0x0) {
          pcVar4 = "Boxes of spec and design cannot be aligned. Cannot proceed.";
          goto LAB_00237de9;
        }
      }
    }
    if (((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) ||
       (iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar1 < 1)) {
      pInit = Gia_ManDup(p);
    }
    else {
      pInit = Gia_ManDupCollapse(p,p->pAigExtra,vBoxPres,fSeq);
    }
    if (((Tim_Man_t *)pGia->pManTime == (Tim_Man_t *)0x0) ||
       (iVar1 = Tim_ManBoxNum((Tim_Man_t *)pGia->pManTime), iVar1 < 1)) {
      pInit_00 = Gia_ManDup(pGia);
    }
    else {
      pInit_00 = Gia_ManDupCollapse(pGia,pGia->pAigExtra,(Vec_Int_t *)0x0,fSeq);
    }
    if (vBoxPres != (Vec_Int_t *)0x0) {
      if (vBoxPres->pArray != (int *)0x0) {
        free(vBoxPres->pArray);
        vBoxPres->pArray = (int *)0x0;
      }
      free(vBoxPres);
    }
  }
  if (fDumpFiles != 0) {
    if (pFileSpec == (char *)0x0) {
      pFileSpec = pGia->pSpec;
    }
    pcVar4 = Extra_FileNameGeneric(pFileSpec);
    sprintf((char *)local_808,"%s_spec.aig",pcVar4);
    sprintf(local_418,"%s_impl.aig",pcVar4);
    Gia_AigerWrite(pInit,(char *)local_808,0,0,0);
    Gia_AigerWrite(pInit_00,local_418,0,0,0);
    if (pcVar4 != (char *)0x0) {
      free(pcVar4);
    }
    printf("Dumped two parts of the miter into files \"%s\" and \"%s\".\n",local_808,local_418);
  }
  if (fSeq == 0) {
    pGVar3 = Gia_ManMiter(pInit,pInit_00,0,1,0,0,fVerbose);
    if (pGVar3 != (Gia_Man_t *)0x0) {
      p_01 = local_808;
      Cec_ManCecSetDefaultParams((Cec_ParCec_t *)p_01);
      pGVar5 = pGVar3;
      local_808[0].fTryComb = nBTLimit;
      local_808[0].fTryBmc = nTimeLim;
      local_808[0].nBddMax = fVerbose;
      iVar1 = Cec_ManVerify(pGVar3,(Cec_ParCec_t *)p_01);
      if (-1 < local_808[0].nBddIterMax) {
        Abc_Print((int)pGVar5,(char *)p_01);
      }
      Gia_ManStop(pGVar3);
      goto LAB_00238096;
    }
  }
  else {
    pGVar3 = Gia_ManMiter(pInit,pInit_00,0,0,1,0,fVerbose);
    if (pGVar3 != (Gia_Man_t *)0x0) {
      Fra_SecSetDefaultParams(local_808);
      local_808[0].fRetimeFirst = 0;
      local_808[0].nBTLimit = nBTLimit;
      local_808[0].fVerbose = fVerbose;
      local_808[0].TimeLimit = nTimeLim;
      p_00 = Gia_ManToAig(pGVar3,0);
      Gia_ManStop(pGVar3);
      iVar1 = Fra_FraigSec(p_00,local_808,(Aig_Man_t **)0x0);
      Aig_ManStop(p_00);
      goto LAB_00238096;
    }
  }
  iVar1 = -1;
LAB_00238096:
  Gia_ManStop(pInit);
  Gia_ManStop(pInit_00);
  Gia_ManStop(p);
  return iVar1;
}

Assistant:

int Gia_ManVerifyWithBoxes( Gia_Man_t * pGia, int nBTLimit, int nTimeLim, int fSeq, int fDumpFiles, int fVerbose, char * pFileSpec )
{
    int Status   = -1;
    Gia_Man_t * pSpec, * pGia0, * pGia1, * pMiter;
    Vec_Int_t * vBoxPres = NULL;
    if ( pFileSpec == NULL && pGia->pSpec == NULL )
    {
        printf( "Spec file is not given. Use standard flow.\n" );
        return Status;
    }
    if ( Gia_ManBoxNum(pGia) && pGia->pAigExtra == NULL )
    {
        printf( "Design has no box logic. Use standard flow.\n" );
        return Status;
    }
    // read original AIG
    pSpec = Gia_AigerRead( pFileSpec ? pFileSpec : pGia->pSpec, 0, 0, 0 );
    if ( Gia_ManBoxNum(pSpec) && pSpec->pAigExtra == NULL )
    {
        Gia_ManStop( pSpec );
        printf( "Spec has no box logic. Use standard flow.\n" );
        return Status;
    }
    // prepare miter
    if ( pGia->pManTime == NULL && pSpec->pManTime == NULL )
    {
        pGia0 = Gia_ManDup( pSpec );
        pGia1 = Gia_ManDup( pGia );
    }
    else
    {
        // if timing managers have different number of black boxes,
        // it is possible that some of the boxes are swept away
        if ( pSpec->pManTime && Tim_ManBlackBoxNum((Tim_Man_t *)pSpec->pManTime) > 0 && Gia_ManBoxNum(pGia) > 0 )
        {
            // specification cannot have fewer boxes than implementation
            if ( Gia_ManBoxNum(pSpec) < Gia_ManBoxNum(pGia) )
            {
                printf( "Spec has less boxes than the design. Cannot proceed.\n" );
                return Status;
            }
            // to align the boxes, find what boxes of pSpec are dropped in pGia
            if ( Gia_ManBoxNum(pSpec) > Gia_ManBoxNum(pGia) )
            {
                vBoxPres = Tim_ManAlignTwo( (Tim_Man_t *)pSpec->pManTime, (Tim_Man_t *)pGia->pManTime );
                if ( vBoxPres == NULL )
                {
                    printf( "Boxes of spec and design cannot be aligned. Cannot proceed.\n" );
                    return Status;
                }
            }
        }
        // collapse two designs
        if ( Gia_ManBoxNum(pSpec) > 0 )
            pGia0 = Gia_ManDupCollapse( pSpec, pSpec->pAigExtra, vBoxPres, fSeq );
        else
            pGia0 = Gia_ManDup( pSpec );
        if ( Gia_ManBoxNum(pGia) > 0 )
            pGia1 = Gia_ManDupCollapse( pGia,  pGia->pAigExtra,  NULL, fSeq  );
        else
            pGia1 = Gia_ManDup( pGia );
        Vec_IntFreeP( &vBoxPres );
    }
    if ( fDumpFiles )
    {
        char pFileName0[1000], pFileName1[1000];
        char * pNameGeneric = Extra_FileNameGeneric( pFileSpec ? pFileSpec : pGia->pSpec );
        sprintf( pFileName0, "%s_spec.aig", pNameGeneric );
        sprintf( pFileName1, "%s_impl.aig", pNameGeneric );
        Gia_AigerWrite( pGia0, pFileName0, 0, 0, 0 );
        Gia_AigerWrite( pGia1, pFileName1, 0, 0, 0 );
        ABC_FREE( pNameGeneric );
        printf( "Dumped two parts of the miter into files \"%s\" and \"%s\".\n", pFileName0, pFileName1 );
    }
    // compute the miter
    if ( fSeq )
    {
        pMiter = Gia_ManMiter( pGia0, pGia1, 0, 0, 1, 0, fVerbose );
        if ( pMiter )
        {
            Aig_Man_t * pMan;
            Fra_Sec_t SecPar, * pSecPar = &SecPar;
            Fra_SecSetDefaultParams( pSecPar );
            pSecPar->fRetimeFirst = 0;
            pSecPar->nBTLimit  = nBTLimit;
            pSecPar->TimeLimit = nTimeLim;
            pSecPar->fVerbose  = fVerbose;
            pMan = Gia_ManToAig( pMiter, 0 );
            Gia_ManStop( pMiter );
            Status = Fra_FraigSec( pMan, pSecPar, NULL );
            Aig_ManStop( pMan );
        }
    }
    else
    {
        pMiter = Gia_ManMiter( pGia0, pGia1, 0, 1, 0, 0, fVerbose );
        if ( pMiter )
        {
            Cec_ParCec_t ParsCec, * pPars = &ParsCec;
            Cec_ManCecSetDefaultParams( pPars );
            pPars->nBTLimit  = nBTLimit;
            pPars->TimeLimit = nTimeLim;
            pPars->fVerbose  = fVerbose;
            Status = Cec_ManVerify( pMiter, pPars );
            if ( pPars->iOutFail >= 0 )
                Abc_Print( 1, "Verification failed for at least one output (%d).\n", pPars->iOutFail );
            Gia_ManStop( pMiter );
        }
    }
    Gia_ManStop( pGia0 );
    Gia_ManStop( pGia1 );
    Gia_ManStop( pSpec );
    return Status;
}